

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3MemoryMappedFile.cpp
# Opt level: O0

void __thiscall w3MemoryMappedFile::~w3MemoryMappedFile(w3MemoryMappedFile *this)

{
  w3MemoryMappedFile *this_local;
  
  if (this->base != (void *)0x0) {
    munmap(this->base,this->size);
    this->base = (void *)0x0;
  }
  w3Fd::~w3Fd(&this->file);
  return;
}

Assistant:

w3MemoryMappedFile::~w3MemoryMappedFile ()
{
    if (!base)
        return;
#if _WIN32
    UnmapViewOfFile (base);
#else
    munmap (base, size);
#endif
    base = 0;
}